

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qcalendarwidget.cpp
# Opt level: O1

void __thiscall QCalendarWidget::setSelectedDate(QCalendarWidget *this,QDate date)

{
  QCalendarWidgetPrivate *this_00;
  QCalendarModel *pQVar1;
  undefined8 uVar2;
  int year;
  int month;
  QDate QVar3;
  long lVar4;
  long in_FS_OFFSET;
  QDate newDate;
  QModelIndex local_58;
  long local_38;
  
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  this_00 = *(QCalendarWidgetPrivate **)&(this->super_QWidget).field_0x8;
  if ((this_00->m_model->m_date).jd == date.jd) {
    local_58.m.ptr = (QAbstractItemModel *)&DAT_aaaaaaaaaaaaaaaa;
    local_58._0_8_ = &DAT_aaaaaaaaaaaaaaaa;
    local_58.i = (quintptr)&DAT_aaaaaaaaaaaaaaaa;
    QAbstractItemView::currentIndex(&local_58,(QAbstractItemView *)this_00->m_view);
    QVar3 = QtPrivate::QCalendarModel::dateForCell(this_00->m_model,local_58.r,local_58.c);
    if ((0x16d3e147973 < date.jd + 0xb69eeff91fU) || (QVar3.jd == date.jd)) goto LAB_003d314f;
  }
  else if (0x16d3e147973 < date.jd + 0xb69eeff91fU) goto LAB_003d314f;
  pQVar1 = this_00->m_model;
  (pQVar1->m_date).jd = date.jd;
  lVar4 = (pQVar1->m_minimumDate).jd;
  if ((date.jd < lVar4) || (lVar4 = (pQVar1->m_maximumDate).jd, lVar4 < date.jd)) {
    (pQVar1->m_date).jd = lVar4;
  }
  QCalendarWidgetPrivate::update(this_00);
  local_58._0_8_ = (this_00->m_model->m_date).jd;
  uVar2 = *(undefined8 *)&this_00->m_model->m_calendar;
  year = QDate::year(&local_58,uVar2);
  month = QDate::month(&local_58,uVar2);
  QCalendarWidgetPrivate::showMonth(this_00,year,month);
  QMetaObject::activate((QObject *)this,&staticMetaObject,0,(void **)0x0);
LAB_003d314f:
  if (*(long *)(in_FS_OFFSET + 0x28) != local_38) {
    __stack_chk_fail();
  }
  return;
}

Assistant:

void QCalendarWidget::setSelectedDate(QDate date)
{
    Q_D(QCalendarWidget);
    if (d->m_model->m_date == date && date == d->getCurrentDate())
        return;

    if (!date.isValid())
        return;

    d->m_model->setDate(date);
    d->update();
    QDate newDate = d->m_model->m_date;
    QCalendar cal = d->m_model->m_calendar;
    d->showMonth(newDate.year(cal), newDate.month(cal));
    emit selectionChanged();
}